

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register.cpp
# Opt level: O0

SubscriptionSync * __thiscall
bidfx_public_api::price::pixie::SubjectSetRegister::CreateSubscriptionSync
          (SubscriptionSync *__return_storage_ptr__,SubjectSetRegister *this,int edition,
          vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
          *subject_set)

{
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  local_a8;
  undefined1 local_90 [8];
  SubscriptionSync subscription_sync;
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  *subject_set_local;
  int edition_local;
  SubjectSetRegister *this_local;
  
  subscription_sync.subjects_.
  super__Vector_base<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)subject_set;
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::vector(&local_a8,subject_set);
  SubscriptionSync::SubscriptionSync((SubscriptionSync *)local_90,edition,&local_a8);
  std::
  vector<bidfx_public_api::price::subject::Subject,_std::allocator<bidfx_public_api::price::subject::Subject>_>
  ::~vector(&local_a8);
  AddSubscriptionControls(this,(SubscriptionSync *)local_90);
  SubscriptionSync::SubscriptionSync(__return_storage_ptr__,(SubscriptionSync *)local_90);
  SubscriptionSync::~SubscriptionSync((SubscriptionSync *)local_90);
  return __return_storage_ptr__;
}

Assistant:

SubscriptionSync SubjectSetRegister::CreateSubscriptionSync(int edition, std::vector<Subject>& subject_set)
{
    SubscriptionSync subscription_sync(edition, subject_set);
    AddSubscriptionControls(subscription_sync);
    return std::move(subscription_sync);
}